

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnklog.cpp
# Opt level: O0

void gnilk::Logger::DisableSink(string *name)

{
  LogManager *this;
  anon_class_8_1_898f2789 local_38;
  SinkDelegate local_30;
  string *local_10;
  string *name_local;
  
  local_10 = name;
  this = LogManager::Instance();
  local_38.name = local_10;
  std::function<bool(gnilk::LogSink*)>::
  function<gnilk::Logger::DisableSink(std::__cxx11::string_const&)::__0,void>
            ((function<bool(gnilk::LogSink*)> *)&local_30,&local_38);
  LogManager::IterateSinks(this,&local_30);
  std::function<bool_(gnilk::LogSink_*)>::~function(&local_30);
  return;
}

Assistant:

void Logger::DisableSink(const std::string &name) {
    LogManager::Instance().IterateSinks([&name](LogSink *sink) {
        if (name == sink->GetName()) {
            sink->SetEnabled(false);
            return false;
        }
        return true;
    });
}